

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O1

int ly_print(lyout *out,char *format,...)

{
  char in_AL;
  int iVar1;
  FILE *pFVar2;
  void *pvVar3;
  ssize_t sVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t size;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __n;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  va_list ap;
  char *local_28;
  char *msg;
  
  ap[0].overflow_arg_area = local_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Da;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_28 = (char *)0x0;
  ap[0]._0_8_ = &stack0x00000008;
  local_48 = 0x3000000010;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  switch(out->type) {
  case LYOUT_FD:
    iVar1 = vdprintf((out->method).fd,format,&local_48);
    break;
  case LYOUT_STREAM:
    iVar1 = vfprintf((FILE *)(out->method).f,format,&local_48);
    break;
  case LYOUT_MEMORY:
    iVar1 = vasprintf(&local_28,format,&local_48);
    __n = (size_t)iVar1;
    size = (long)(out->method).clb.arg + __n + 1;
    if ((out->method).mem.size < size) {
      pFVar2 = (FILE *)ly_realloc((out->method).f,size);
      if (pFVar2 == (FILE *)0x0) {
        (out->method).f = (FILE *)0x0;
        (out->method).mem.len = 0;
        (out->method).mem.size = 0;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_print");
        return -1;
      }
      (out->method).f = pFVar2;
      (out->method).mem.size = (long)(out->method).clb.arg + __n + 1;
    }
    memcpy((void *)((long)&((out->method).f)->_flags + (long)(out->method).clb.arg),local_28,__n);
    pvVar3 = (void *)(__n + (long)(out->method).clb.arg);
    (out->method).clb.arg = pvVar3;
    *(undefined1 *)((long)&((out->method).f)->_flags + (long)pvVar3) = 0;
    goto LAB_00173761;
  case LYOUT_CALLBACK:
    iVar1 = vasprintf(&local_28,format,&local_48);
    sVar4 = (*(out->method).clb.f)((void *)(out->method).mem.len,local_28,(long)iVar1);
    iVar1 = (int)sVar4;
LAB_00173761:
    free(local_28);
    break;
  default:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
ly_print(struct lyout *out, const char *format, ...)
{
    int count = 0;
    char *msg = NULL, *aux;
    va_list ap;
#ifndef HAVE_VDPRINTF
    FILE *stream;
#endif

    va_start(ap, format);

    switch (out->type) {
    case LYOUT_FD:
#ifdef HAVE_VDPRINTF
        count = vdprintf(out->method.fd, format, ap);
#else
        stream = fdopen(dup(out->method.fd), "a+");
        if (stream) {
            count = vfprintf(stream, format, ap);
            fclose(stream);
        }
#endif
        break;
    case LYOUT_STREAM:
        count = vfprintf(out->method.f, format, ap);
        break;
    case LYOUT_MEMORY:
        count = vasprintf(&msg, format, ap);
        if (out->method.mem.len + count + 1 > out->method.mem.size) {
            aux = ly_realloc(out->method.mem.buf, out->method.mem.len + count + 1);
            if (!aux) {
                out->method.mem.buf = NULL;
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                va_end(ap);
                return -1;
            }
            out->method.mem.buf = aux;
            out->method.mem.size = out->method.mem.len + count + 1;
        }
        memcpy(&out->method.mem.buf[out->method.mem.len], msg, count);
        out->method.mem.len += count;
        out->method.mem.buf[out->method.mem.len] = '\0';
        free(msg);
        break;
    case LYOUT_CALLBACK:
        count = vasprintf(&msg, format, ap);
        count = out->method.clb.f(out->method.clb.arg, msg, count);
        free(msg);
        break;
    }

    va_end(ap);
    return count;
}